

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

Result_Type __thiscall
chaiscript::detail::Dispatch_Engine::
boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>
          (Dispatch_Engine *this,Boxed_Value *bv)

{
  Conversion_Saves *t_saves;
  long in_RSI;
  Type_Conversions *in_RDI;
  Result_Type RVar1;
  Type_Conversions_State state;
  Type_Conversions_State *in_stack_000000c0;
  Boxed_Value *in_stack_000000c8;
  Type_Conversions *this_00;
  
  t_saves = (Conversion_Saves *)(in_RSI + 0x28);
  this_00 = in_RDI;
  Type_Conversions::conversion_saves((Type_Conversions *)0x256bda);
  Type_Conversions_State::Type_Conversions_State((Type_Conversions_State *)this_00,in_RDI,t_saves);
  RVar1 = chaiscript::boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>
                    (in_stack_000000c8,in_stack_000000c0);
  RVar1.
  super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this_00;
  return (Result_Type)
         RVar1.
         super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

typename detail::Cast_Helper<Type>::Result_Type boxed_cast(const Boxed_Value &bv) const
          {
            Type_Conversions_State state(m_conversions, m_conversions.conversion_saves());
            return chaiscript::boxed_cast<Type>(bv, &state);
          }